

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

matrix2d * __thiscall tinyusdz::value::matrix2d::operator=(matrix2d *this,matrix2f *src)

{
  matrix2d *pmVar1;
  size_t j;
  long lVar2;
  long lVar3;
  
  pmVar1 = this;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      (*(double (*) [2])*(double (*) [2])this)[lVar3] =
           (double)(*(float (*) [2])*(float (*) [2])src)[lVar3];
    }
    this = (matrix2d *)((long)this + 0x10);
    src = (matrix2f *)((long)src + 8);
  }
  return pmVar1;
}

Assistant:

matrix2d &matrix2d::operator=(const matrix2f &src) {

  for (size_t j = 0; j < 2; j++) {
    for (size_t i = 0; i < 2; i++) {
      m[j][i] = double(src.m[j][i]);
    }
  }

  return *this;
}